

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O0

void __thiscall TApp_RequiresMultiFlags_Test::TestBody(TApp_RequiresMultiFlags_Test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  bool bVar1;
  Option *pOVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_6d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_650;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_5d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_520;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4d0;
  allocator local_42c;
  allocator local_42b;
  allocator local_42a;
  allocator local_429;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  string local_400 [32];
  string local_3e0 [32];
  string local_3c0 [32];
  iterator local_3a0;
  size_type local_398;
  AssertHelper local_390;
  Message local_388 [2];
  RequiresError *anon_var_0_2;
  char *pcStack_370;
  bool gtest_caught_expected_2;
  ConstCharPtr gtest_msg_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  string local_338 [32];
  string local_318 [32];
  iterator local_2f8;
  size_type local_2f0;
  AssertHelper local_2e8;
  Message local_2e0 [2];
  RequiresError *anon_var_0_1;
  char *pcStack_2c8;
  bool gtest_caught_expected_1;
  ConstCharPtr gtest_msg_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  string local_290 [32];
  iterator local_270;
  size_type local_268;
  AssertHelper local_260;
  Message local_258 [2];
  RequiresError *anon_var_0;
  char *pcStack_240;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  iterator local_208;
  size_type local_200;
  undefined1 local_1f2;
  allocator local_1f1 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  iterator local_1c8;
  size_type local_1c0;
  undefined1 local_1b2;
  allocator local_1b1 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  iterator local_188;
  size_type local_180;
  allocator local_171;
  string local_170;
  allocator local_149;
  string local_148;
  allocator local_121;
  string local_120;
  allocator local_f9;
  string local_f8;
  Option *local_d8;
  Option *opt3;
  string local_c8;
  allocator local_a1;
  string local_a0;
  Option *local_80;
  Option *opt2;
  string local_70;
  allocator local_39;
  string local_38;
  Option *local_18;
  Option *opt1;
  TApp_RequiresMultiFlags_Test *this_local;
  
  opt1 = (Option *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"--opt1",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"",(allocator *)((long)&opt2 + 7));
  pOVar2 = CLI::App::add_flag(&(this->super_TApp).app,&local_38,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)((long)&opt2 + 7));
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_18 = pOVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a0,"--opt2",&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c8,"",(allocator *)((long)&opt3 + 7));
  pOVar2 = CLI::App::add_flag(&(this->super_TApp).app,&local_a0,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&opt3 + 7));
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  local_80 = pOVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8,"--opt3",&local_f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_120,"",&local_121);
  pOVar2 = CLI::App::add_flag(&(this->super_TApp).app,&local_f8,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  local_d8 = pOVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_148,"--optall",&local_149);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_170,"",&local_171);
  pOVar2 = CLI::App::add_flag(&(this->super_TApp).app,&local_148,&local_170);
  CLI::Option::requires<CLI::Option*,CLI::Option*,CLI::Option*>(pOVar2,local_18,local_80,local_d8);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator((allocator<char> *)&local_171);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator((allocator<char> *)&local_149);
  TApp::run(&this->super_TApp);
  CLI::App::reset(&(this->super_TApp).app);
  local_1b2 = '\x01';
  local_1b1._1_8_ = &local_1a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1a8,"--opt1",local_1b1);
  local_1b2 = '\0';
  local_188 = &local_1a8;
  local_180 = 1;
  __l_04._M_len = 1;
  __l_04._M_array = local_188;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l_04);
  local_4d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_188;
  do {
    local_4d0 = local_4d0 + -1;
    std::__cxx11::string::~string((string *)local_4d0);
  } while (local_4d0 != &local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)local_1b1);
  TApp::run(&this->super_TApp);
  CLI::App::reset(&(this->super_TApp).app);
  local_1f2 = '\x01';
  local_1f1._1_8_ = &local_1e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1e8,"--opt2",local_1f1);
  local_1f2 = '\0';
  local_1c8 = &local_1e8;
  local_1c0 = 1;
  __l_03._M_len = 1;
  __l_03._M_array = local_1c8;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l_03);
  local_4f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1c8;
  do {
    local_4f8 = local_4f8 + -1;
    std::__cxx11::string::~string((string *)local_4f8);
  } while (local_4f8 != &local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)local_1f1);
  TApp::run(&this->super_TApp);
  CLI::App::reset(&(this->super_TApp).app);
  gtest_msg.value._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_228,"--optall",(allocator *)((long)&gtest_msg.value + 7));
  gtest_msg.value._6_1_ = 0;
  local_208 = &local_228;
  local_200 = 1;
  __l_02._M_len = 1;
  __l_02._M_array = local_208;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l_02);
  local_520 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_208;
  do {
    local_520 = local_520 + -1;
    std::__cxx11::string::~string((string *)local_520);
  } while (local_520 != &local_228);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg.value + 7));
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffdc0,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffdc0);
  if (bVar1) {
    anon_var_0._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      TApp::run(&this->super_TApp);
    }
    if ((anon_var_0._7_1_ & 1) == 0) {
      pcStack_240 = 
      "Expected: run() throws an exception of type CLI::RequiresError.\n  Actual: it throws nothing."
      ;
      goto LAB_00147ea3;
    }
  }
  else {
LAB_00147ea3:
    testing::Message::Message(local_258);
    testing::internal::AssertHelper::AssertHelper
              (&local_260,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x42e,pcStack_240);
    testing::internal::AssertHelper::operator=(&local_260,local_258);
    testing::internal::AssertHelper::~AssertHelper(&local_260);
    testing::Message::~Message(local_258);
  }
  CLI::App::reset(&(this->super_TApp).app);
  gtest_msg_1.value._5_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_2b0,"--optall",(allocator *)((long)&gtest_msg_1.value + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_290,"--opt1",(allocator *)((long)&gtest_msg_1.value + 6));
  gtest_msg_1.value._5_1_ = 0;
  local_270 = &local_2b0;
  local_268 = 2;
  __l_01._M_len = 2;
  __l_01._M_array = local_270;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l_01);
  local_5d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_270;
  do {
    local_5d8 = local_5d8 + -1;
    std::__cxx11::string::~string((string *)local_5d8);
  } while (local_5d8 != &local_2b0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg_1.value + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg_1.value + 7));
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffd38,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffd38);
  if (bVar1) {
    anon_var_0_1._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      TApp::run(&this->super_TApp);
    }
    if ((anon_var_0_1._7_1_ & 1) == 0) {
      pcStack_2c8 = 
      "Expected: run() throws an exception of type CLI::RequiresError.\n  Actual: it throws nothing."
      ;
      goto LAB_00148244;
    }
  }
  else {
LAB_00148244:
    testing::Message::Message(local_2e0);
    testing::internal::AssertHelper::AssertHelper
              (&local_2e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x432,pcStack_2c8);
    testing::internal::AssertHelper::operator=(&local_2e8,local_2e0);
    testing::internal::AssertHelper::~AssertHelper(&local_2e8);
    testing::Message::~Message(local_2e0);
  }
  CLI::App::reset(&(this->super_TApp).app);
  gtest_msg_2.value._4_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_358,"--optall",(allocator *)((long)&gtest_msg_2.value + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_338,"--opt2",(allocator *)((long)&gtest_msg_2.value + 6));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_318,"--opt1",(allocator *)((long)&gtest_msg_2.value + 5));
  gtest_msg_2.value._4_1_ = 0;
  local_2f8 = &local_358;
  local_2f0 = 3;
  __l_00._M_len = 3;
  __l_00._M_array = local_2f8;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l_00);
  local_650 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2f8;
  do {
    local_650 = local_650 + -1;
    std::__cxx11::string::~string((string *)local_650);
  } while (local_650 != &local_358);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg_2.value + 5));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg_2.value + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg_2.value + 7));
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffc90,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffc90);
  if (bVar1) {
    anon_var_0_2._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      TApp::run(&this->super_TApp);
    }
    if ((anon_var_0_2._7_1_ & 1) != 0) goto LAB_001486ea;
    pcStack_370 = 
    "Expected: run() throws an exception of type CLI::RequiresError.\n  Actual: it throws nothing.";
  }
  testing::Message::Message(local_388);
  testing::internal::AssertHelper::AssertHelper
            (&local_390,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x436,pcStack_370);
  testing::internal::AssertHelper::operator=(&local_390,local_388);
  testing::internal::AssertHelper::~AssertHelper(&local_390);
  testing::Message::~Message(local_388);
LAB_001486ea:
  CLI::App::reset(&(this->super_TApp).app);
  local_428 = &local_420;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_420,"--optall",&local_429);
  local_428 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_400;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_400,"--opt1",&local_42a);
  local_428 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3e0,"--opt2",&local_42b);
  local_428 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3c0,"--opt3",&local_42c);
  local_3a0 = &local_420;
  local_398 = 4;
  __l._M_len = 4;
  __l._M_array = local_3a0;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l);
  local_6d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3a0;
  do {
    local_6d8 = local_6d8 + -1;
    std::__cxx11::string::~string((string *)local_6d8);
  } while (local_6d8 != &local_420);
  std::allocator<char>::~allocator((allocator<char> *)&local_42c);
  std::allocator<char>::~allocator((allocator<char> *)&local_42b);
  std::allocator<char>::~allocator((allocator<char> *)&local_42a);
  std::allocator<char>::~allocator((allocator<char> *)&local_429);
  TApp::run(&this->super_TApp);
  return;
}

Assistant:

TEST_F(TApp, RequiresMultiFlags) {
    CLI::Option *opt1 = app.add_flag("--opt1");
    CLI::Option *opt2 = app.add_flag("--opt2");
    CLI::Option *opt3 = app.add_flag("--opt3");
    app.add_flag("--optall")->requires(opt1, opt2, opt3);

    run();

    app.reset();
    args = {"--opt1"};
    run();

    app.reset();
    args = {"--opt2"};
    run();

    app.reset();
    args = {"--optall"};
    EXPECT_THROW(run(), CLI::RequiresError);

    app.reset();
    args = {"--optall", "--opt1"};
    EXPECT_THROW(run(), CLI::RequiresError);

    app.reset();
    args = {"--optall", "--opt2", "--opt1"};
    EXPECT_THROW(run(), CLI::RequiresError);

    app.reset();
    args = {"--optall", "--opt1", "--opt2", "--opt3"};
    run();
}